

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_day
                 (year_t y,month_t m,diff_t d,diff_t cd,hour_t hh,minute_t mm,second_t ss)

{
  int iVar1;
  int iVar2;
  int n_3;
  int n_2;
  int n_1;
  int n;
  int yi;
  year_t oey;
  year_t ey;
  minute_t mm_local;
  long lStack_38;
  hour_t hh_local;
  diff_t cd_local;
  diff_t d_local;
  month_t m_local;
  year_t y_local;
  
  oey = (cd / 0x23ab1) * 400 + y % 400;
  lStack_38 = cd % 0x23ab1;
  if (lStack_38 < 0) {
    oey = oey + -400;
    lStack_38 = lStack_38 + 0x23ab1;
  }
  oey = (d / 0x23ab1) * 400 + oey;
  cd_local = d % 0x23ab1 + lStack_38;
  if (cd_local < 1) {
    if (cd_local < -0x16c) {
      oey = oey + -400;
      cd_local = cd_local + 0x23ab1;
    }
    else {
      oey = oey + -1;
      iVar1 = days_per_year(oey,m);
      cd_local = iVar1 + cd_local;
    }
  }
  else if (0x23ab1 < cd_local) {
    oey = oey + 400;
    cd_local = cd_local + -0x23ab1;
  }
  if (0x16d < cd_local) {
    iVar1 = year_index(oey,m);
    while (n_1 = iVar1, iVar2 = days_per_century(n_1), iVar1 = n_1, iVar2 < cd_local) {
      cd_local = cd_local - iVar2;
      oey = oey + 100;
      iVar1 = n_1 + 100;
      if (399 < n_1 + 100) {
        iVar1 = n_1 + -300;
      }
    }
    while (n_1 = iVar1, iVar1 = days_per_4years(n_1), iVar1 < cd_local) {
      cd_local = cd_local - iVar1;
      oey = oey + 4;
      iVar1 = n_1 + 4;
      if (399 < n_1 + 4) {
        iVar1 = n_1 + -0x18c;
      }
    }
    for (; iVar1 = days_per_year(oey,m), iVar1 < cd_local; cd_local = cd_local - iVar1) {
      oey = oey + 1;
    }
  }
  d_local._7_1_ = m;
  if (0x1c < cd_local) {
    while (iVar1 = days_per_month(oey,d_local._7_1_), iVar1 < cd_local) {
      cd_local = cd_local - iVar1;
      d_local._7_1_ = d_local._7_1_ + '\x01';
      if ('\f' < d_local._7_1_) {
        oey = oey + 1;
        d_local._7_1_ = '\x01';
      }
    }
  }
  detail::fields::fields
            ((fields *)&y_local,y + (oey - y % 400),d_local._7_1_,(day_t)cd_local,hh,mm,ss);
  return _y_local;
}

Assistant:

CONSTEXPR_F fields n_day(year_t y, month_t m, diff_t d, diff_t cd, hour_t hh,
                         minute_t mm, second_t ss) noexcept {
  year_t ey = y % 400;
  const year_t oey = ey;
  ey += (cd / 146097) * 400;
  cd %= 146097;
  if (cd < 0) {
    ey -= 400;
    cd += 146097;
  }
  ey += (d / 146097) * 400;
  d = d % 146097 + cd;
  if (d > 0) {
    if (d > 146097) {
      ey += 400;
      d -= 146097;
    }
  } else {
    if (d > -365) {
      // We often hit the previous year when stepping a civil time backwards,
      // so special case it to avoid counting up by 100/4/1-year chunks.
      ey -= 1;
      d += days_per_year(ey, m);
    } else {
      ey -= 400;
      d += 146097;
    }
  }
  if (d > 365) {
    int yi = year_index(ey, m);  // Index into Gregorian 400 year cycle.
    for (;;) {
      int n = days_per_century(yi);
      if (d <= n) break;
      d -= n;
      ey += 100;
      yi += 100;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_4years(yi);
      if (d <= n) break;
      d -= n;
      ey += 4;
      yi += 4;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_year(ey, m);
      if (d <= n) break;
      d -= n;
      ++ey;
    }
  }
  if (d > 28) {
    for (;;) {
      int n = days_per_month(ey, m);
      if (d <= n) break;
      d -= n;
      if (++m > 12) {
        ++ey;
        m = 1;
      }
    }
  }
  return fields(y + (ey - oey), m, static_cast<day_t>(d), hh, mm, ss);
}